

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Real Omega_h::repro_sum(Reals *a)

{
  int iVar1;
  Reals *pRVar2;
  Int128 IVar3;
  double ret;
  undefined1 local_78 [8];
  Int128 fixpt_sum;
  double unit;
  int init;
  Read<double> local_50;
  int local_3c;
  Reals *pRStack_38;
  int expo;
  Reals *a_local;
  Reals *local_28;
  Reals *local_20;
  Reals *local_18;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_10 >> 3) == 0) {
    a_local = (Reals *)0x0;
  }
  else {
    pRStack_38 = a;
    local_28 = a;
    local_20 = a;
    local_18 = a;
    begin_code("repro_sum",(char *)0x0);
    Read<double>::Read(&local_50,a);
    iVar1 = max_exponent(&local_50);
    Read<double>::~Read(&local_50);
    if (iVar1 == -0x80000000) {
      a_local = (Reals *)0x0;
    }
    else {
      local_3c = iVar1;
      fixpt_sum.low = (uint64_t)exp2((double)(iVar1 + -0x34));
      Read<double>::Read((Read<double> *)&ret,a);
      IVar3 = int128_sum((Read<double> *)&ret,(double)fixpt_sum.low);
      fixpt_sum.high = IVar3.low;
      local_78 = (undefined1  [8])IVar3.high;
      Read<double>::~Read((Read<double> *)&ret);
      pRVar2 = (Reals *)Int128::to_double((Int128 *)local_78,(double)fixpt_sum.low);
      end_code();
      a_local = pRVar2;
    }
  }
  return (Real)a_local;
}

Assistant:

Real repro_sum(Reals a) {
  if (a.size() == 0) {
    return 0.0;
  }
  begin_code("repro_sum");
  int expo = max_exponent(a);
  auto const init = ArithTraits<int>::min();
  if (expo == init) return 0.0;
  double unit = exp2(double(expo - MANTISSA_BITS));
  Int128 fixpt_sum = int128_sum(a, unit);
  double ret = fixpt_sum.to_double(unit);
  end_code();
  return ret;
}